

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectref.hpp
# Opt level: O2

FieldRef<int> __thiscall stackjit::ClassRef::getField<int>(ClassRef *this,string *name,Type *type)

{
  bool bVar1;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  size_type sVar2;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_01;
  mapped_type *this_02;
  Type *pTVar3;
  BytePtr puVar4;
  size_t sVar5;
  runtime_error *prVar6;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &ClassMetadata::fields_abi_cxx11_(this->mMetadata)->_M_h;
  sVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count(this_00,name);
  if (sVar2 == 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&bStack_a8,"There exists no field called \'",name);
    std::operator+(&local_88,&bStack_a8,"\' in the class \'");
    psVar7 = Type::name_abi_cxx11_((this->mObjRef).mType);
    std::operator+(&local_68,&local_88,psVar7);
    std::operator+(&local_48,&local_68,"\'.");
    std::runtime_error::runtime_error(prVar6,(string *)&local_48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)ClassMetadata::fields_abi_cxx11_(this->mMetadata);
  this_02 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::at(this_01,name);
  pTVar3 = Field::type(this_02);
  bVar1 = Type::operator!=(pTVar3,type);
  if (!bVar1) {
    puVar4 = ObjectRef::dataPtr(&this->mObjRef);
    sVar5 = Field::offset(this_02);
    return (FieldRef<int>)(puVar4 + sVar5);
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  psVar7 = Type::name_abi_cxx11_(type);
  std::operator+(&bStack_a8,"Expected field to be of type \'",psVar7);
  std::operator+(&local_88,&bStack_a8,"\' but got type \'");
  pTVar3 = Field::type(this_02);
  psVar7 = Type::name_abi_cxx11_(pTVar3);
  std::operator+(&local_68,&local_88,psVar7);
  std::operator+(&local_48,&local_68,"\'.");
  std::runtime_error::runtime_error(prVar6,(string *)&local_48);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FieldRef<T> ClassRef::getField(std::string name, const Type* type) {
		if (mMetadata.fields().count(name) > 0) {
			auto& fieldRef = mMetadata.fields().at(name);

			if (*fieldRef.type() != *type) {
				throw std::runtime_error(
					"Expected field to be of type '" + type->name() + "' but got type '" + fieldRef.type()->name() + "'.");
			}

			return FieldRef<T>(mObjRef.dataPtr() + (std::size_t)fieldRef.offset());
		} else {
			throw std::runtime_error(
				"There exists no field called '" + name + "' in the class '" + mObjRef.type()->name() + "'.");
		}
	}